

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testEncodeDecode(void)

{
  int iVar1;
  long lVar2;
  EncodeTestRecord *t;
  int local_10;
  int nr;
  int i;
  int nrTests;
  
  nr = 0;
  printf("%d encodes\n",0x3dee);
  for (local_10 = 0; local_10 < 0x3dee; local_10 = local_10 + 1) {
    lVar2 = (long)local_10;
    showTestProgress(local_10,0x3dee,nr);
    iVar1 = testEncodeAndDecode(ENCODE_TEST[lVar2].mapcode,ENCODE_TEST[lVar2].latitude,
                                ENCODE_TEST[lVar2].longitude,ENCODE_TEST[lVar2].nrLocalMapcodes,
                                ENCODE_TEST[lVar2].nrGlobalMapcodes);
    nr = iVar1 + nr;
  }
  return nr;
}

Assistant:

static int testEncodeDecode(void) {
    int nrTests = 0;
    int i = 0;
    int nr = sizeof(ENCODE_TEST) / sizeof(ENCODE_TEST[0]) - 1;
    printf("%d encodes\n", nr);
    for (i = 0; i < nr; i++) {
        const EncodeTestRecord *t = &ENCODE_TEST[i];
        showTestProgress(i, nr, nrTests);
        nrTests += testEncodeAndDecode(t->mapcode, t->latitude, t->longitude,
                                       t->nrLocalMapcodes, t->nrGlobalMapcodes);
    }
    return nrTests;
}